

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O2

void duckdb::DefineReservoirQuantile(AggregateFunctionSet *set,LogicalType *type)

{
  vector<duckdb::AggregateFunction,_true> *this;
  AggregateFunction fun;
  undefined1 auStack_738 [304];
  AggregateFunction local_608;
  AggregateFunction local_4d8;
  AggregateFunction local_3a8;
  AggregateFunction local_278;
  AggregateFunction local_148;
  
  GetReservoirQuantileAggregate((AggregateFunction *)auStack_738,type->physical_type_);
  AggregateFunction::AggregateFunction(&local_148,(AggregateFunction *)auStack_738);
  this = &(set->super_FunctionSet<duckdb::AggregateFunction>).functions;
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_148);
  AggregateFunction::~AggregateFunction(&local_148);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)(auStack_738 + 0x48)
             ,&LogicalType::INTEGER);
  AggregateFunction::AggregateFunction(&local_278,(AggregateFunction *)auStack_738);
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_278);
  AggregateFunction::~AggregateFunction(&local_278);
  GetReservoirQuantileListAggregate(&local_3a8,type);
  AggregateFunction::operator=((AggregateFunction *)auStack_738,&local_3a8);
  AggregateFunction::~AggregateFunction(&local_3a8);
  AggregateFunction::AggregateFunction(&local_4d8,(AggregateFunction *)auStack_738);
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_4d8);
  AggregateFunction::~AggregateFunction(&local_4d8);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)(auStack_738 + 0x48)
             ,&LogicalType::INTEGER);
  AggregateFunction::AggregateFunction(&local_608,(AggregateFunction *)auStack_738);
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_608);
  AggregateFunction::~AggregateFunction(&local_608);
  AggregateFunction::~AggregateFunction((AggregateFunction *)auStack_738);
  return;
}

Assistant:

static void DefineReservoirQuantile(AggregateFunctionSet &set, const LogicalType &type) {
	//	Four versions: type, scalar/list[, count]
	auto fun = GetReservoirQuantileAggregate(type.InternalType());
	set.AddFunction(fun);

	fun.arguments.emplace_back(LogicalType::INTEGER);
	set.AddFunction(fun);

	// List variants
	fun = GetReservoirQuantileListAggregate(type);
	set.AddFunction(fun);

	fun.arguments.emplace_back(LogicalType::INTEGER);
	set.AddFunction(fun);
}